

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O1

Var Js::JavascriptError::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  Type TVar6;
  charcount_t cVar7;
  charcount_t cVar8;
  undefined4 *puVar9;
  Var pvVar10;
  RecyclableObject *pRVar11;
  RecyclableObject *this;
  JavascriptString *pJVar12;
  JavascriptString *this_00;
  StaticType *pSVar13;
  JavascriptString *pstRight;
  int in_stack_00000010;
  undefined1 local_58 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  Var local_38;
  Var value;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0xbc,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bcca45;
    *puVar9 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_58 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_58,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_58 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0xbf,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar4) goto LAB_00bcca45;
    *puVar9 = 0;
  }
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0xc1,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00bcca45;
    *puVar9 = 0;
  }
  pvVar10 = Arguments::operator[]((Arguments *)local_58,0);
  if (pvVar10 == (Var)0x0) {
LAB_00bcca47:
    ThrowTypeError(pSVar1,-0x7ff5ec41,L"Error.prototype.toString");
  }
  pvVar10 = Arguments::operator[]((Arguments *)local_58,0);
  BVar5 = JavascriptOperators::IsObject(pvVar10);
  if (BVar5 == 0) goto LAB_00bcca47;
  pvVar10 = Arguments::operator[]((Arguments *)local_58,0);
  pRVar11 = VarTo<Js::RecyclableObject>(pvVar10);
  local_38 = (Var)0x0;
  BVar5 = JavascriptOperators::GetPropertyNoCache(pRVar11,0x106,&local_38,pSVar1);
  pvVar10 = local_38;
  if (BVar5 == 0) {
LAB_00bcc775:
    pJVar2 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
    pSVar13 = StringCache::GetStringTypeStatic(&pJVar2->stringCache);
    pJVar12 = &LiteralString::New(pSVar13,L"Error",5,pJVar2->recycler)->super_JavascriptString;
  }
  else {
    if (local_38 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00bcca45;
      *puVar9 = 0;
    }
    if (((ulong)pvVar10 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00bcca45;
      *puVar9 = 0;
    }
    if (pvVar10 < (Var)0x4000000000000 && ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000)
    {
      this = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00bcca45;
        *puVar9 = 0;
      }
      TVar6 = ((this->type).ptr)->typeId;
      if (0x57 < (int)TVar6) {
        BVar5 = RecyclableObject::IsExternal(this);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar4) goto LAB_00bcca45;
          *puVar9 = 0;
        }
        TVar6 = TypeIds_FirstNumberType;
      }
    }
    else {
      TVar6 = TypeIds_FirstNumberType;
    }
    if (TVar6 == TypeIds_Undefined) goto LAB_00bcc775;
    pJVar12 = JavascriptConversion::ToString(local_38,pSVar1);
  }
  BVar5 = JavascriptOperators::GetPropertyNoCache(pRVar11,0x102,&local_38,pSVar1);
  pvVar10 = local_38;
  if (BVar5 != 0) {
    if (local_38 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00bcca45;
      *puVar9 = 0;
    }
    if (((ulong)pvVar10 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00bcca45;
      *puVar9 = 0;
    }
    if (pvVar10 < (Var)0x4000000000000 && ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000)
    {
      pRVar11 = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
      if (pRVar11 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00bcca45;
        *puVar9 = 0;
      }
      TVar6 = ((pRVar11->type).ptr)->typeId;
      if (0x57 < (int)TVar6) {
        BVar5 = RecyclableObject::IsExternal(pRVar11);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar4) {
LAB_00bcca45:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar9 = 0;
        }
        goto LAB_00bcc9a8;
      }
    }
    else {
LAB_00bcc9a8:
      TVar6 = TypeIds_FirstNumberType;
    }
    if (TVar6 != TypeIds_Undefined) {
      this_00 = JavascriptConversion::ToString(local_38,pSVar1);
      goto LAB_00bcc9c8;
    }
  }
  this_00 = JavascriptLibrary::GetEmptyString((pSVar1->super_ScriptContextBase).javascriptLibrary);
LAB_00bcc9c8:
  cVar7 = JavascriptString::GetLength(pJVar12);
  cVar8 = JavascriptString::GetLength(this_00);
  if ((cVar7 == 0) || (cVar8 == 0)) {
    if (cVar8 != 0) {
      pJVar12 = this_00;
    }
  }
  else {
    pJVar2 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
    pSVar13 = StringCache::GetStringTypeStatic(&pJVar2->stringCache);
    pstRight = &LiteralString::New(pSVar13,L": ",2,pJVar2->recycler)->super_JavascriptString;
    pJVar12 = JavascriptString::Concat(pJVar12,pstRight);
    pJVar12 = JavascriptString::Concat(pJVar12,this_00);
  }
  return pJVar12;
}

Assistant:

Var JavascriptError::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args[0] == 0 || !JavascriptOperators::IsObject(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Error.prototype.toString"));
        }

        RecyclableObject* thisError = VarTo<RecyclableObject>(args[0]);
        Var value = NULL;
        JavascriptString *outputStr, *message;

        // get error.name
        BOOL hasName = JavascriptOperators::GetPropertyNoCache(thisError, PropertyIds::name, &value, scriptContext) &&
            JavascriptOperators::GetTypeId(value) != TypeIds_Undefined;

        if (hasName)
        {
            outputStr = JavascriptConversion::ToString(value, scriptContext);
        }
        else
        {
            outputStr = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("Error"));
        }

        // get error.message
        if (JavascriptOperators::GetPropertyNoCache(thisError, PropertyIds::message, &value, scriptContext)
            && JavascriptOperators::GetTypeId(value) != TypeIds_Undefined)
        {
            message = JavascriptConversion::ToString(value, scriptContext);
        }
        else
        {
            message = scriptContext->GetLibrary()->GetEmptyString();
        }

        charcount_t nameLen = outputStr->GetLength();
        charcount_t msgLen = message->GetLength();

        if (nameLen > 0 && msgLen > 0)
        {
            outputStr = JavascriptString::Concat(outputStr, scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u(": ")));
            outputStr = JavascriptString::Concat(outputStr, message);
        }
        else if (msgLen > 0)
        {
            outputStr = message;
        }

        return outputStr;
    }